

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_averages_and_directions.cpp
# Opt level: O0

void compute_avgs_and_dirs_3_comp_rgb(partition_info *pi,image_block *blk,partition_metrics *pm)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  long lVar41;
  long in_RDX;
  image_block *in_RSI;
  ushort *in_RDI;
  undefined8 uVar42;
  vfloat4 vVar43;
  vmask4 mask;
  vfloat4 best_sum;
  vfloat4 best_vector;
  vfloat4 prod_zp;
  vfloat4 prod_yp;
  vfloat4 prod_xp;
  vmask4 tdm2;
  vmask4 tdm1;
  vmask4 tdm0;
  vfloat4 zero;
  vfloat4 texel_datum;
  uint iwt;
  uint i;
  vfloat4 sum_zp;
  vfloat4 sum_yp;
  vfloat4 sum_xp;
  vfloat4 average;
  uint texel_count;
  uint8_t *texel_indexes;
  uint partition;
  vfloat4 partition_averages [4];
  uint partition_count;
  undefined8 local_10f8;
  undefined8 uStackY_10f0;
  undefined8 local_10e8;
  ulong uStackY_10e0;
  undefined8 local_10d8;
  undefined8 uStackY_10d0;
  undefined8 local_10c8;
  undefined8 uStackY_10c0;
  undefined8 local_10b8;
  undefined8 uStackY_10b0;
  undefined8 local_10a8;
  undefined8 uStackY_10a0;
  undefined8 local_1098;
  ulong uStackY_1090;
  undefined8 local_1088;
  undefined8 uStackY_1080;
  undefined8 local_1078;
  ulong uStackY_1070;
  undefined8 local_1068;
  undefined8 uStackY_1060;
  undefined8 local_1058;
  undefined8 uStackY_1050;
  undefined8 local_1048;
  undefined8 uStackY_1040;
  undefined8 local_1038;
  undefined8 uStackY_1030;
  undefined8 local_1028;
  ulong uStackY_1020;
  undefined8 local_1018;
  undefined8 uStackY_1010;
  undefined8 local_1008;
  ulong uStackY_1000;
  undefined8 local_ff8;
  undefined8 uStackY_ff0;
  undefined8 local_fe8;
  undefined8 uStackY_fe0;
  undefined8 local_fd8;
  ulong uStackY_fd0;
  undefined8 local_fc8;
  undefined8 uStackY_fc0;
  undefined8 local_fb8;
  undefined8 local_fa8;
  undefined8 uStackY_fa0;
  undefined8 local_f98;
  undefined8 uStackY_f90;
  uint local_f80;
  uint local_f7c;
  undefined8 local_f78;
  undefined8 uStackY_f70;
  undefined8 local_f68;
  undefined8 uStackY_f60;
  undefined8 local_f58;
  undefined8 uStackY_f50;
  undefined8 local_f48;
  undefined8 uStackY_f40;
  uint local_f2c;
  ushort *local_f28;
  uint local_f1c;
  undefined8 local_f18 [8];
  uint local_ed4;
  long local_ed0;
  image_block *local_ec8;
  ushort *local_ec0;
  undefined1 local_eb8 [16];
  undefined1 local_ea8 [16];
  undefined1 local_e98 [16];
  undefined1 local_e88 [16];
  undefined8 local_e78;
  undefined8 uStackY_e70;
  undefined8 local_e68;
  undefined8 uStackY_e60;
  undefined1 local_e58 [16];
  undefined8 local_e48;
  undefined8 uStackY_e40;
  undefined8 local_e38;
  undefined8 uStackY_e30;
  undefined1 local_e28 [16];
  undefined8 local_e18;
  undefined8 uStackY_e10;
  undefined8 local_e08;
  undefined8 uStackY_e00;
  undefined1 local_df8 [16];
  undefined8 local_de8;
  ulong uStackY_de0;
  undefined8 local_dd8;
  undefined8 uStackY_dd0;
  undefined1 local_dc8 [16];
  undefined8 local_db8;
  ulong uStackY_db0;
  undefined8 local_da8;
  undefined8 uStackY_da0;
  undefined1 local_d98 [16];
  undefined8 local_d88;
  ulong uStackY_d80;
  undefined8 local_d78;
  undefined8 uStackY_d70;
  undefined1 local_d68 [24];
  undefined8 *local_d50;
  undefined1 local_d48 [16];
  undefined8 local_d38;
  undefined8 uStackY_d30;
  undefined8 local_d28;
  undefined8 uStackY_d20;
  undefined8 local_d18;
  undefined8 uStackY_d10;
  undefined8 *local_d08;
  undefined8 *local_d00;
  undefined8 local_cf8;
  undefined8 uStackY_cf0;
  undefined8 local_ce8;
  undefined8 uStackY_ce0;
  undefined8 local_cd8;
  undefined8 uStackY_cd0;
  undefined8 *local_cc8;
  undefined8 *local_cc0;
  undefined8 local_cb8;
  undefined8 uStackY_cb0;
  undefined8 local_ca8;
  undefined8 uStackY_ca0;
  undefined8 local_c98;
  undefined8 uStackY_c90;
  undefined8 *local_c88;
  undefined8 *local_c80;
  undefined8 local_c78;
  undefined8 uStackY_c70;
  undefined8 local_c68;
  undefined8 uStackY_c60;
  undefined8 local_c58;
  undefined8 uStackY_c50;
  undefined1 local_c48 [16];
  undefined8 local_c38;
  undefined8 uStackY_c30;
  undefined8 local_c28;
  undefined8 uStackY_c20;
  undefined8 local_c18;
  undefined8 uStackY_c10;
  undefined1 local_c08 [16];
  undefined8 local_bf8;
  undefined8 uStackY_bf0;
  undefined8 local_be8;
  undefined8 uStackY_be0;
  undefined8 local_bd8;
  undefined8 uStackY_bd0;
  undefined1 local_bc8 [16];
  undefined8 local_bb8;
  undefined8 uStackY_bb0;
  undefined8 local_ba8;
  undefined8 uStackY_ba0;
  undefined8 local_b98;
  ulong uStackY_b90;
  undefined1 local_b88 [16];
  undefined8 local_b78;
  undefined8 uStackY_b70;
  undefined8 local_b68;
  undefined8 uStackY_b60;
  undefined8 local_b58;
  ulong uStackY_b50;
  undefined1 local_b48 [16];
  undefined8 local_b38;
  undefined8 uStackY_b30;
  undefined8 local_b28;
  undefined8 uStackY_b20;
  undefined8 local_b18;
  ulong uStackY_b10;
  undefined1 local_b08 [24];
  undefined8 *local_af0;
  undefined1 local_ae8 [24];
  undefined8 *local_ad0;
  undefined1 local_ac8 [16];
  undefined8 local_ab8;
  undefined8 uStackY_ab0;
  undefined8 local_aa8;
  undefined8 uStackY_aa0;
  undefined8 local_a98;
  undefined8 uStackY_a90;
  undefined8 local_a88;
  undefined8 uStackY_a80;
  undefined8 local_a78;
  undefined8 uStackY_a70;
  undefined8 local_a68;
  undefined8 uStackY_a60;
  undefined1 local_a58 [16];
  undefined8 local_a48;
  undefined8 uStackY_a40;
  undefined8 local_a38;
  undefined8 uStackY_a30;
  undefined8 local_a28;
  undefined8 uStackY_a20;
  undefined8 local_a18;
  undefined8 uStackY_a10;
  undefined8 local_a08;
  undefined8 uStackY_a00;
  undefined8 local_9f8;
  undefined8 uStackY_9f0;
  undefined1 local_9e8 [16];
  undefined8 local_9d8;
  undefined8 uStackY_9d0;
  undefined8 local_9c8;
  undefined8 uStackY_9c0;
  undefined8 local_9b8;
  undefined8 uStackY_9b0;
  undefined8 local_9a8;
  undefined8 uStackY_9a0;
  undefined8 local_998;
  undefined8 uStackY_990;
  undefined8 local_988;
  undefined8 uStackY_980;
  undefined1 local_978 [20];
  float local_964;
  undefined1 *local_960;
  float local_954;
  undefined1 *local_950;
  float local_944;
  undefined1 *local_940;
  ulong local_938;
  undefined8 uStackY_930;
  undefined8 local_928;
  undefined8 uStackY_920;
  ulong local_918;
  undefined8 uStackY_910;
  undefined8 local_908;
  undefined8 uStackY_900;
  ulong local_8f8;
  undefined8 uStackY_8f0;
  undefined8 local_8e8;
  undefined8 uStackY_8e0;
  undefined8 local_8d8;
  undefined8 uStackY_8d0;
  undefined8 local_8c8;
  undefined8 uStackY_8c0;
  undefined1 local_8b8 [16];
  undefined8 local_8a8;
  undefined8 uStackY_8a0;
  undefined8 local_898;
  undefined8 uStackY_890;
  undefined1 local_888 [16];
  undefined8 local_878;
  undefined8 uStackY_870;
  undefined8 local_868;
  undefined8 uStackY_860;
  undefined1 local_858 [16];
  undefined8 local_848;
  undefined8 uStackY_840;
  undefined8 local_838;
  undefined8 uStackY_830;
  undefined8 local_828;
  undefined8 uStackY_820;
  undefined8 local_818;
  undefined8 uStackY_810;
  undefined8 local_808;
  undefined8 uStackY_800;
  undefined8 local_7f8;
  undefined8 uStackY_7f0;
  float local_7e8;
  float fStackY_7e4;
  float fStackY_7e0;
  float fStackY_7dc;
  undefined1 *local_7d0;
  float local_7c8;
  float fStackY_7c4;
  float fStackY_7c0;
  float fStackY_7bc;
  undefined1 *local_7b0;
  float local_7a8;
  float fStackY_7a4;
  float fStackY_7a0;
  float fStackY_79c;
  undefined1 *local_790;
  undefined4 local_788;
  undefined4 uStackY_784;
  undefined4 uStackY_780;
  undefined4 uStackY_77c;
  undefined1 *local_770;
  undefined4 local_768;
  undefined4 uStackY_764;
  undefined4 uStackY_760;
  undefined4 uStackY_75c;
  undefined1 *local_750;
  undefined1 local_748 [16];
  undefined1 *local_730;
  undefined1 local_728 [16];
  undefined1 *local_710;
  undefined1 local_708 [16];
  undefined1 *local_6f0;
  undefined1 local_6e8 [16];
  undefined1 *local_6d0;
  undefined1 local_6c8 [16];
  undefined1 *local_6b0;
  undefined1 local_6a8 [16];
  undefined1 *local_690;
  undefined4 local_688;
  undefined4 uStackY_684;
  undefined4 uStackY_680;
  undefined4 uStackY_67c;
  undefined1 *local_670;
  undefined1 local_668 [16];
  undefined1 *local_650;
  undefined8 local_648;
  undefined8 uStackY_640;
  undefined1 *local_630;
  undefined8 local_628;
  undefined8 uStackY_620;
  undefined1 *local_610;
  undefined8 local_608;
  undefined8 uStackY_600;
  undefined1 *local_5f0;
  undefined8 local_5e8;
  ulong uStackY_5e0;
  undefined1 *local_5d0;
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  undefined8 local_588;
  undefined8 uStackY_580;
  undefined8 local_578;
  undefined8 uStackY_570;
  undefined8 local_568;
  ulong uStackY_560;
  undefined8 local_558;
  undefined8 uStackY_550;
  undefined8 local_548;
  ulong uStackY_540;
  undefined8 local_538;
  undefined8 uStackY_530;
  undefined8 local_528;
  ulong uStackY_520;
  undefined8 local_518;
  undefined8 uStackY_510;
  undefined8 local_508;
  undefined8 uStackY_500;
  undefined8 local_4f8;
  undefined8 uStackY_4f0;
  undefined8 local_4e8;
  undefined8 uStackY_4e0;
  undefined8 local_4d8;
  undefined8 uStackY_4d0;
  undefined1 local_4c8 [16];
  undefined1 *local_4b0;
  undefined1 local_4a8 [16];
  undefined1 *local_490;
  undefined1 local_488 [16];
  undefined1 *local_470;
  undefined1 local_468 [16];
  undefined1 *local_450;
  undefined1 local_448 [16];
  undefined1 *local_430;
  undefined8 local_428;
  undefined8 uStackY_420;
  undefined8 local_418;
  undefined8 uStackY_410;
  undefined1 local_408 [16];
  float local_3f8;
  float fStackY_3f4;
  float fStackY_3f0;
  float fStackY_3ec;
  undefined1 *local_3e0;
  undefined8 local_3d8;
  undefined8 uStackY_3d0;
  undefined8 local_3c8;
  undefined8 uStackY_3c0;
  undefined1 local_3b8 [16];
  float local_3a8;
  float fStackY_3a4;
  float fStackY_3a0;
  float fStackY_39c;
  undefined1 *local_390;
  undefined8 local_388;
  undefined8 uStackY_380;
  undefined8 local_378;
  undefined8 uStackY_370;
  undefined1 local_368 [16];
  float local_358;
  float fStackY_354;
  float fStackY_350;
  float fStackY_34c;
  undefined1 *local_340;
  undefined8 local_338;
  undefined8 uStackY_330;
  undefined8 local_328;
  undefined8 uStackY_320;
  undefined8 local_318;
  undefined8 uStackY_310;
  undefined8 local_308;
  undefined8 uStackY_300;
  undefined8 local_2f8;
  undefined8 uStackY_2f0;
  undefined8 local_2e8;
  undefined8 uStackY_2e0;
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  undefined8 uStackY_2c0;
  undefined1 local_2b8 [16];
  undefined8 local_2a8;
  undefined8 uStackY_2a0;
  undefined1 local_298 [16];
  undefined8 local_288;
  undefined8 uStackY_280;
  undefined8 local_278;
  undefined8 uStackY_270;
  undefined8 local_268;
  undefined8 uStackY_260;
  undefined8 local_258;
  ulong uStackY_250;
  undefined8 local_248;
  undefined8 uStackY_240;
  undefined8 local_238;
  undefined8 uStackY_230;
  undefined8 local_228;
  ulong uStackY_220;
  undefined8 local_218;
  undefined8 uStackY_210;
  undefined8 local_208;
  undefined8 uStackY_200;
  undefined8 local_1f8;
  ulong uStackY_1f0;
  undefined8 local_1e8;
  undefined8 uStackY_1e0;
  undefined8 local_1d8;
  undefined8 uStackY_1d0;
  undefined8 local_1c8;
  undefined8 uStackY_1c0;
  undefined8 local_1b8;
  undefined8 uStackY_1b0;
  undefined8 local_1a8;
  undefined8 uStackY_1a0;
  undefined8 local_198;
  undefined8 uStackY_190;
  undefined8 local_188;
  undefined8 uStackY_180;
  undefined8 local_178;
  undefined8 uStackY_170;
  undefined8 local_168;
  undefined8 uStackY_160;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  partition_info *in_stack_fffffffffffffeb8;
  ulong local_88;
  ulong local_68;
  ulong local_48;
  
  local_ed4 = (uint)*in_RDI;
  if (local_ed4 == 0) {
    __assert_fail("partition_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                  ,0x23e,
                  "void compute_avgs_and_dirs_3_comp_rgb(const partition_info &, const image_block &, partition_metrics *)"
                 );
  }
  local_ed0 = in_RDX;
  local_ec8 = in_RSI;
  local_ec0 = in_RDI;
  compute_partition_averages_rgb
            (in_stack_fffffffffffffeb8,
             (image_block *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (vfloat4 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  local_f1c = 0;
  while( true ) {
    if (local_ed4 <= local_f1c) {
      return;
    }
    local_f28 = local_ec0 + (ulong)local_f1c * 0x6c + 0x80;
    local_f2c = (uint)*(byte *)((long)local_ec0 + (ulong)local_f1c + 4);
    if (local_f2c == 0) break;
    local_f48 = local_f18[(ulong)local_f1c * 2];
    uStackY_f40 = local_f18[(ulong)local_f1c * 2 + 1];
    puVar1 = (undefined8 *)(local_ed0 + (ulong)local_f1c * 0x20);
    *puVar1 = local_f48;
    puVar1[1] = uStackY_f40;
    local_5b8 = ZEXT816(0) << 0x20;
    local_5c8 = local_5b8;
    auVar7 = local_5c8;
    local_5c8._8_8_ = SUB168(ZEXT816(0),4);
    local_630 = local_e88;
    local_648 = 0;
    local_648 = 0;
    uStackY_640 = local_5c8._8_8_;
    local_f58 = 0;
    uStackY_f50 = local_5c8._8_8_;
    local_610 = local_e98;
    local_628 = 0;
    local_628 = 0;
    uStackY_620 = local_5c8._8_8_;
    local_f68 = 0;
    uStackY_f60 = local_5c8._8_8_;
    local_5a8 = local_5b8;
    local_5f0 = local_ea8;
    local_608 = 0;
    local_608 = 0;
    uStackY_600 = local_5c8._8_8_;
    local_f78 = 0;
    uVar42 = local_5c8._8_8_;
    local_5c8 = auVar7;
    for (local_f7c = 0; uStackY_f70 = uVar42, local_f7c < local_f2c; local_f7c = local_f7c + 1) {
      local_f80 = (uint)*(byte *)((long)local_f28 + (ulong)local_f7c);
      vVar43 = image_block::texel3(local_ec8,local_f80);
      local_fb8 = vVar43.m._0_8_;
      local_fc8 = local_f48;
      uStackY_fc0 = uStackY_f40;
      local_e68 = local_fb8;
      uStackY_e60 = uVar42;
      local_e78 = local_f48;
      uStackY_e70 = uStackY_f40;
      local_578 = local_fb8;
      uStackY_570 = uVar42;
      local_588 = local_f48;
      uStackY_580 = uStackY_f40;
      auVar3._8_8_ = uVar42;
      auVar3._0_8_ = local_fb8;
      auVar2._8_8_ = uStackY_f40;
      auVar2._0_8_ = local_f48;
      local_668 = vsubps_avx(auVar3,auVar2);
      local_650 = local_e58;
      auVar10 = local_668;
      local_fa8 = local_668._0_8_;
      uStackY_fa0 = local_668._8_8_;
      local_f98 = local_668._0_8_;
      uVar27 = local_f98;
      uStackY_f90 = local_668._8_8_;
      uVar28 = uStackY_f90;
      local_598 = ZEXT816(0) << 0x20;
      auVar11 = local_598;
      local_598._8_8_ = SUB168(ZEXT816(0),4);
      local_5d0 = local_eb8;
      local_5e8 = 0;
      local_5e8 = 0;
      uStackY_5e0 = local_598._8_8_;
      local_fd8 = 0;
      uStackY_fd0 = local_598._8_8_;
      local_d50 = &local_f98;
      local_f98._0_4_ = local_668._0_4_;
      local_670 = local_d48;
      local_688 = (undefined4)local_f98;
      uStackY_684 = (undefined4)local_f98;
      uStackY_680 = (undefined4)local_f98;
      uStackY_67c = (undefined4)local_f98;
      local_ff8 = CONCAT44((undefined4)local_f98,(undefined4)local_f98);
      uStackY_ff0 = CONCAT44((undefined4)local_f98,(undefined4)local_f98);
      local_1008 = 0;
      uStackY_1000 = local_598._8_8_;
      local_d78 = local_ff8;
      uStackY_d70 = uStackY_ff0;
      local_d88 = 0;
      uStackY_d80 = local_598._8_8_;
      local_558 = local_ff8;
      uStackY_550 = uStackY_ff0;
      local_568 = 0;
      uStackY_560 = local_598._8_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_598._8_8_;
      auVar4._8_8_ = uStackY_ff0;
      auVar4._0_8_ = local_ff8;
      local_4c8 = vcmpps_avx(auVar21 << 0x40,auVar4,1);
      local_4b0 = local_d68;
      auVar12 = local_4c8;
      local_fe8 = local_4c8._0_8_;
      uStackY_fe0 = local_4c8._8_8_;
      local_1028 = 0;
      uStackY_1020 = local_598._8_8_;
      local_1038 = local_668._0_8_;
      uStackY_1030 = local_668._8_8_;
      local_1048 = local_4c8._0_8_;
      uStackY_1040 = local_4c8._8_8_;
      local_b18 = 0;
      uStackY_b10 = local_598._8_8_;
      local_b28 = local_668._0_8_;
      uStackY_b20 = local_668._8_8_;
      local_b38 = local_4c8._0_8_;
      uStackY_b30 = local_4c8._8_8_;
      local_258 = 0;
      uStackY_250 = local_598._8_8_;
      local_268 = local_668._0_8_;
      uStackY_260 = local_668._8_8_;
      local_278 = local_4c8._0_8_;
      uStackY_270 = local_4c8._8_8_;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_598._8_8_;
      local_748 = vblendvps_avx(auVar22 << 0x40,local_668,local_4c8);
      local_730 = local_b08;
      auVar7 = local_748;
      local_1018 = local_748._0_8_;
      uStackY_1010 = local_748._8_8_;
      local_c80 = &local_f58;
      local_c88 = &local_1018;
      local_ca8 = local_f58;
      uStackY_ca0 = uStackY_f50;
      local_cb8 = local_748._0_8_;
      uStackY_cb0 = local_748._8_8_;
      local_418 = local_f58;
      uStackY_410 = uStackY_f50;
      local_428 = local_748._0_8_;
      uStackY_420 = local_748._8_8_;
      local_2e8 = local_f58;
      uVar39 = local_2e8;
      uStackY_2e0 = uStackY_f50;
      uVar40 = uStackY_2e0;
      local_2f8 = local_748._0_8_;
      uVar37 = local_2f8;
      uStackY_2f0 = local_748._8_8_;
      uVar38 = uStackY_2f0;
      local_2e8._0_4_ = (float)local_f58;
      local_2e8._4_4_ = (float)((ulong)local_f58 >> 0x20);
      uStackY_2e0._0_4_ = (float)uStackY_f50;
      uStackY_2e0._4_4_ = (float)((ulong)uStackY_f50 >> 0x20);
      local_2f8._0_4_ = local_748._0_4_;
      local_2f8._4_4_ = local_748._4_4_;
      uStackY_2f0._0_4_ = local_748._8_4_;
      uStackY_2f0._4_4_ = local_748._12_4_;
      local_3e0 = local_408;
      local_3f8 = (float)local_2e8 + (float)local_2f8;
      fStackY_3f4 = local_2e8._4_4_ + local_2f8._4_4_;
      fStackY_3f0 = (float)uStackY_2e0 + (float)uStackY_2f0;
      fStackY_3ec = uStackY_2e0._4_4_ + uStackY_2f0._4_4_;
      local_f58 = CONCAT44(local_2e8._4_4_ + local_2f8._4_4_,(float)local_2e8 + (float)local_2f8);
      uStackY_f50 = CONCAT44(uStackY_2e0._4_4_ + uStackY_2f0._4_4_,
                             (float)uStackY_2e0 + (float)uStackY_2f0);
      local_c98 = local_f58;
      uStackY_c90 = uStackY_f50;
      local_af0 = &local_f98;
      local_f98._4_4_ = local_668._4_4_;
      local_750 = local_ae8;
      local_768 = local_f98._4_4_;
      uStackY_764 = local_f98._4_4_;
      uStackY_760 = local_f98._4_4_;
      uStackY_75c = local_f98._4_4_;
      local_1068 = CONCAT44(local_f98._4_4_,local_f98._4_4_);
      uStackY_1060 = CONCAT44(local_f98._4_4_,local_f98._4_4_);
      local_1078 = 0;
      uStackY_1070 = local_598._8_8_;
      local_da8 = local_1068;
      uStackY_da0 = uStackY_1060;
      local_db8 = 0;
      uStackY_db0 = local_598._8_8_;
      local_538 = local_1068;
      uStackY_530 = uStackY_1060;
      local_548 = 0;
      uStackY_540 = local_598._8_8_;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_598._8_8_;
      auVar5._8_8_ = uStackY_1060;
      auVar5._0_8_ = local_1068;
      local_4a8 = vcmpps_avx(auVar23 << 0x40,auVar5,1);
      local_490 = local_d98;
      auVar13 = local_4a8;
      local_1058 = local_4a8._0_8_;
      uStackY_1050 = local_4a8._8_8_;
      local_1098 = 0;
      uStackY_1090 = local_598._8_8_;
      local_10a8 = local_668._0_8_;
      uStackY_10a0 = local_668._8_8_;
      local_10b8 = local_4a8._0_8_;
      uStackY_10b0 = local_4a8._8_8_;
      local_b58 = 0;
      uStackY_b50 = local_598._8_8_;
      local_b68 = local_668._0_8_;
      uStackY_b60 = local_668._8_8_;
      local_b78 = local_4a8._0_8_;
      uStackY_b70 = local_4a8._8_8_;
      local_228 = 0;
      uStackY_220 = local_598._8_8_;
      local_238 = local_668._0_8_;
      uStackY_230 = local_668._8_8_;
      local_248 = local_4a8._0_8_;
      uStackY_240 = local_4a8._8_8_;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_598._8_8_;
      local_728 = vblendvps_avx(auVar24 << 0x40,local_668,local_4a8);
      local_710 = local_b48;
      auVar8 = local_728;
      local_1088 = local_728._0_8_;
      uStackY_1080 = local_728._8_8_;
      local_cc0 = &local_f68;
      local_cc8 = &local_1088;
      local_ce8 = local_f68;
      uStackY_ce0 = uStackY_f60;
      local_cf8 = local_728._0_8_;
      uStackY_cf0 = local_728._8_8_;
      local_3c8 = local_f68;
      uStackY_3c0 = uStackY_f60;
      local_3d8 = local_728._0_8_;
      uStackY_3d0 = local_728._8_8_;
      local_308 = local_f68;
      uVar35 = local_308;
      uStackY_300 = uStackY_f60;
      uVar36 = uStackY_300;
      local_318 = local_728._0_8_;
      uVar33 = local_318;
      uStackY_310 = local_728._8_8_;
      uVar34 = uStackY_310;
      local_308._0_4_ = (float)local_f68;
      local_308._4_4_ = (float)((ulong)local_f68 >> 0x20);
      uStackY_300._0_4_ = (float)uStackY_f60;
      uStackY_300._4_4_ = (float)((ulong)uStackY_f60 >> 0x20);
      local_318._0_4_ = local_728._0_4_;
      local_318._4_4_ = local_728._4_4_;
      uStackY_310._0_4_ = local_728._8_4_;
      uStackY_310._4_4_ = local_728._12_4_;
      local_390 = local_3b8;
      local_3a8 = (float)local_308 + (float)local_318;
      fStackY_3a4 = local_308._4_4_ + local_318._4_4_;
      fStackY_3a0 = (float)uStackY_300 + (float)uStackY_310;
      fStackY_39c = uStackY_300._4_4_ + uStackY_310._4_4_;
      local_f68 = CONCAT44(local_308._4_4_ + local_318._4_4_,(float)local_308 + (float)local_318);
      uStackY_f60 = CONCAT44(uStackY_300._4_4_ + uStackY_310._4_4_,
                             (float)uStackY_300 + (float)uStackY_310);
      local_cd8 = local_f68;
      uStackY_cd0 = uStackY_f60;
      local_ad0 = &local_f98;
      uStackY_f90._0_4_ = local_668._8_4_;
      local_770 = local_ac8;
      local_788 = (undefined4)uStackY_f90;
      uStackY_784 = (undefined4)uStackY_f90;
      uStackY_780 = (undefined4)uStackY_f90;
      uStackY_77c = (undefined4)uStackY_f90;
      local_10d8 = CONCAT44((undefined4)uStackY_f90,(undefined4)uStackY_f90);
      uStackY_10d0 = CONCAT44((undefined4)uStackY_f90,(undefined4)uStackY_f90);
      local_10e8 = 0;
      uStackY_10e0 = local_598._8_8_;
      local_dd8 = local_10d8;
      uStackY_dd0 = uStackY_10d0;
      local_de8 = 0;
      uStackY_de0 = local_598._8_8_;
      local_518 = local_10d8;
      uStackY_510 = uStackY_10d0;
      local_528 = 0;
      uStackY_520 = local_598._8_8_;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_598._8_8_;
      auVar6._8_8_ = uStackY_10d0;
      auVar6._0_8_ = local_10d8;
      local_488 = vcmpps_avx(auVar25 << 0x40,auVar6,1);
      local_470 = local_dc8;
      auVar14 = local_488;
      local_10c8 = local_488._0_8_;
      uStackY_10c0 = local_488._8_8_;
      local_b98 = 0;
      uStackY_b90 = local_598._8_8_;
      local_ba8 = local_668._0_8_;
      uStackY_ba0 = local_668._8_8_;
      local_bb8 = local_488._0_8_;
      uStackY_bb0 = local_488._8_8_;
      local_1f8 = 0;
      uStackY_1f0 = local_598._8_8_;
      local_208 = local_668._0_8_;
      uStackY_200 = local_668._8_8_;
      local_218 = local_488._0_8_;
      uStackY_210 = local_488._8_8_;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_598._8_8_;
      local_708 = vblendvps_avx(auVar26 << 0x40,local_668,local_488);
      local_6f0 = local_b88;
      auVar9 = local_708;
      local_10f8 = local_708._0_8_;
      uStackY_10f0 = local_708._8_8_;
      local_d00 = &local_f78;
      local_d08 = &local_10f8;
      local_d28 = local_f78;
      uStackY_d20 = uStackY_f70;
      local_d38 = local_708._0_8_;
      uStackY_d30 = local_708._8_8_;
      local_378 = local_f78;
      uStackY_370 = uStackY_f70;
      local_388 = local_708._0_8_;
      uStackY_380 = local_708._8_8_;
      local_328 = local_f78;
      uVar31 = local_328;
      uStackY_320 = uStackY_f70;
      uVar32 = uStackY_320;
      local_338 = local_708._0_8_;
      uVar29 = local_338;
      uStackY_330 = local_708._8_8_;
      uVar30 = uStackY_330;
      local_328._0_4_ = (float)local_f78;
      local_328._4_4_ = (float)((ulong)local_f78 >> 0x20);
      uStackY_320._0_4_ = (float)uStackY_f70;
      uStackY_320._4_4_ = (float)((ulong)uStackY_f70 >> 0x20);
      local_338._0_4_ = local_708._0_4_;
      local_338._4_4_ = local_708._4_4_;
      uStackY_330._0_4_ = local_708._8_4_;
      uStackY_330._4_4_ = local_708._12_4_;
      local_340 = local_368;
      local_358 = (float)local_328 + (float)local_338;
      fStackY_354 = local_328._4_4_ + local_338._4_4_;
      fStackY_350 = (float)uStackY_320 + (float)uStackY_330;
      fStackY_34c = uStackY_320._4_4_ + uStackY_330._4_4_;
      local_f78 = CONCAT44(local_328._4_4_ + local_338._4_4_,(float)local_328 + (float)local_338);
      uVar42 = CONCAT44(uStackY_320._4_4_ + uStackY_330._4_4_,
                        (float)uStackY_320 + (float)uStackY_330);
      local_d18 = local_f78;
      uStackY_d10 = uVar42;
      local_f98 = uVar27;
      uStackY_f90 = uVar28;
      local_748 = auVar7;
      local_728 = auVar8;
      local_708 = auVar9;
      local_668 = auVar10;
      local_598 = auVar11;
      local_4c8 = auVar12;
      local_4a8 = auVar13;
      local_488 = auVar14;
      local_338 = uVar29;
      uStackY_330 = uVar30;
      local_328 = uVar31;
      uStackY_320 = uVar32;
      local_318 = uVar33;
      uStackY_310 = uVar34;
      local_308 = uVar35;
      uStackY_300 = uVar36;
      local_2f8 = uVar37;
      uStackY_2f0 = uVar38;
      local_2e8 = uVar39;
      uStackY_2e0 = uVar40;
    }
    local_988 = local_f58;
    uStackY_980 = uStackY_f50;
    local_998 = local_f58;
    uStackY_990 = uStackY_f50;
    local_9b8 = local_f58;
    uStackY_9b0 = uStackY_f50;
    local_9c8 = local_f58;
    uStackY_9c0 = uStackY_f50;
    local_8c8 = local_f58;
    uStackY_8c0 = uStackY_f50;
    local_8d8 = local_f58;
    uStackY_8d0 = uStackY_f50;
    local_7f8 = local_f58;
    uVar30 = local_7f8;
    uStackY_7f0 = uStackY_f50;
    uVar31 = uStackY_7f0;
    local_808 = local_f58;
    uStackY_800 = uStackY_f50;
    local_7f8._0_4_ = (float)local_f58;
    local_7f8._4_4_ = (float)((ulong)local_f58 >> 0x20);
    uStackY_7f0._0_4_ = (float)uStackY_f50;
    uStackY_7f0._4_4_ = (float)((ulong)uStackY_f50 >> 0x20);
    local_7a8 = (float)local_7f8 * (float)local_7f8;
    fStackY_7a4 = local_7f8._4_4_ * local_7f8._4_4_;
    local_790 = local_8b8;
    fStackY_7a0 = (float)uStackY_7f0 * (float)uStackY_7f0;
    fStackY_79c = uStackY_7f0._4_4_ * uStackY_7f0._4_4_;
    local_9a8 = CONCAT44(fStackY_7a4,local_7a8);
    uStackY_9a0 = CONCAT44(uStackY_7f0._4_4_ * uStackY_7f0._4_4_,
                           (float)uStackY_7f0 * (float)uStackY_7f0);
    local_9d8 = local_9a8;
    uStackY_9d0 = uStackY_9a0;
    local_928 = local_9a8;
    uStackY_920 = uStackY_9a0;
    auVar20._8_8_ = uStackY_9a0;
    auVar20._0_8_ = local_9a8;
    auVar19._8_8_ = uStackY_9a0;
    auVar19._0_8_ = local_9a8;
    local_298 = vunpckhpd_avx(auVar19,auVar20);
    local_288 = local_9a8;
    uStackY_280 = uStackY_9a0;
    auVar19 = local_298;
    local_964 = local_7a8 + (float)local_298._0_4_ + fStackY_7a4 + (float)local_298._4_4_;
    local_48 = (ulong)(uint)local_964;
    local_938 = local_48;
    uStackY_930 = 0;
    local_960 = local_978;
    local_e18 = CONCAT44(local_964,local_964);
    uStackY_e10 = CONCAT44(local_964,local_964);
    local_9f8 = local_f68;
    uStackY_9f0 = uStackY_f60;
    local_a08 = local_f68;
    uStackY_a00 = uStackY_f60;
    local_a28 = local_f68;
    uStackY_a20 = uStackY_f60;
    local_a38 = local_f68;
    uStackY_a30 = uStackY_f60;
    local_898 = local_f68;
    uStackY_890 = uStackY_f60;
    local_8a8 = local_f68;
    uStackY_8a0 = uStackY_f60;
    local_818 = local_f68;
    uVar28 = local_818;
    uStackY_810 = uStackY_f60;
    uVar29 = uStackY_810;
    local_828 = local_f68;
    uStackY_820 = uStackY_f60;
    local_818._0_4_ = (float)local_f68;
    local_818._4_4_ = (float)((ulong)local_f68 >> 0x20);
    uStackY_810._0_4_ = (float)uStackY_f60;
    uStackY_810._4_4_ = (float)((ulong)uStackY_f60 >> 0x20);
    local_7c8 = (float)local_818 * (float)local_818;
    fStackY_7c4 = local_818._4_4_ * local_818._4_4_;
    local_7b0 = local_888;
    fStackY_7c0 = (float)uStackY_810 * (float)uStackY_810;
    fStackY_7bc = uStackY_810._4_4_ * uStackY_810._4_4_;
    local_a18 = CONCAT44(fStackY_7c4,local_7c8);
    uStackY_a10 = CONCAT44(uStackY_810._4_4_ * uStackY_810._4_4_,
                           (float)uStackY_810 * (float)uStackY_810);
    local_a48 = local_a18;
    uStackY_a40 = uStackY_a10;
    local_908 = local_a18;
    uStackY_900 = uStackY_a10;
    auVar18._8_8_ = uStackY_a10;
    auVar18._0_8_ = local_a18;
    auVar17._8_8_ = uStackY_a10;
    auVar17._0_8_ = local_a18;
    local_2b8 = vunpckhpd_avx(auVar17,auVar18);
    local_2a8 = local_a18;
    uStackY_2a0 = uStackY_a10;
    auVar17 = local_2b8;
    local_954 = local_7c8 + (float)local_2b8._0_4_ + fStackY_7c4 + (float)local_2b8._4_4_;
    local_68 = (ulong)(uint)local_954;
    local_918 = local_68;
    uStackY_910 = 0;
    local_950 = local_9e8;
    local_e08 = CONCAT44(local_954,local_954);
    uStackY_e00 = CONCAT44(local_954,local_954);
    local_a68 = local_f78;
    uStackY_a60 = uVar42;
    local_a78 = local_f78;
    uStackY_a70 = uVar42;
    local_a98 = local_f78;
    uStackY_a90 = uVar42;
    local_aa8 = local_f78;
    uStackY_aa0 = uVar42;
    local_868 = local_f78;
    uStackY_860 = uVar42;
    local_878 = local_f78;
    uStackY_870 = uVar42;
    local_838 = local_f78;
    uVar27 = local_838;
    uStackY_830 = uVar42;
    uVar42 = uStackY_830;
    local_848 = local_f78;
    uStackY_840 = uVar42;
    local_838._0_4_ = (float)local_f78;
    local_838._4_4_ = (float)((ulong)local_f78 >> 0x20);
    uStackY_830._0_4_ = (float)uVar42;
    uStackY_830._4_4_ = (float)((ulong)uVar42 >> 0x20);
    local_7e8 = (float)local_838 * (float)local_838;
    fStackY_7e4 = local_838._4_4_ * local_838._4_4_;
    local_7d0 = local_858;
    fStackY_7e0 = (float)uStackY_830 * (float)uStackY_830;
    fStackY_7dc = uStackY_830._4_4_ * uStackY_830._4_4_;
    local_a88 = CONCAT44(fStackY_7e4,local_7e8);
    uStackY_a80 = CONCAT44(uStackY_830._4_4_ * uStackY_830._4_4_,
                           (float)uStackY_830 * (float)uStackY_830);
    local_ab8 = local_a88;
    uStackY_ab0 = uStackY_a80;
    local_8e8 = local_a88;
    uStackY_8e0 = uStackY_a80;
    auVar16._8_8_ = uStackY_a80;
    auVar16._0_8_ = local_a88;
    auVar15._8_8_ = uStackY_a80;
    auVar15._0_8_ = local_a88;
    local_2d8 = vunpckhpd_avx(auVar15,auVar16);
    local_2c8 = local_a88;
    uStackY_2c0 = uStackY_a80;
    auVar16 = local_2d8;
    local_944 = local_7e8 + (float)local_2d8._0_4_ + fStackY_7e4 + (float)local_2d8._4_4_;
    local_88 = (ulong)(uint)local_944;
    local_8f8 = local_88;
    uStackY_8f0 = 0;
    local_940 = local_a58;
    local_e38 = CONCAT44(local_944,local_944);
    uStackY_e30 = CONCAT44(local_944,local_944);
    local_4f8 = local_e08;
    uStackY_4f0 = uStackY_e00;
    local_508 = local_e18;
    uStackY_500 = uStackY_e10;
    auVar7._8_8_ = uStackY_e10;
    auVar7._0_8_ = local_e18;
    auVar8._8_8_ = uStackY_e00;
    auVar8._0_8_ = local_e08;
    local_468 = vcmpps_avx(auVar7,auVar8,1);
    local_450 = local_df8;
    auVar15 = local_468;
    local_bd8 = local_f58;
    uStackY_bd0 = uStackY_f50;
    local_be8 = local_f68;
    uStackY_be0 = uStackY_f60;
    local_bf8 = local_468._0_8_;
    uStackY_bf0 = local_468._8_8_;
    local_1c8 = local_f58;
    uStackY_1c0 = uStackY_f50;
    local_1d8 = local_f68;
    uStackY_1d0 = uStackY_f60;
    local_1e8 = local_468._0_8_;
    uStackY_1e0 = local_468._8_8_;
    auVar11._8_8_ = uStackY_f50;
    auVar11._0_8_ = local_f58;
    auVar10._8_8_ = uStackY_f60;
    auVar10._0_8_ = local_f68;
    local_6e8 = vblendvps_avx(auVar11,auVar10,local_468);
    local_6d0 = local_bc8;
    auVar7 = local_6e8;
    local_c18 = local_e18;
    uStackY_c10 = uStackY_e10;
    local_c28 = local_e08;
    uStackY_c20 = uStackY_e00;
    local_c38 = local_468._0_8_;
    uStackY_c30 = local_468._8_8_;
    local_198 = local_e18;
    uStackY_190 = uStackY_e10;
    local_1a8 = local_e08;
    uStackY_1a0 = uStackY_e00;
    local_1b8 = local_468._0_8_;
    uStackY_1b0 = local_468._8_8_;
    auVar13._8_8_ = uStackY_e10;
    auVar13._0_8_ = local_e18;
    auVar12._8_8_ = uStackY_e00;
    auVar12._0_8_ = local_e08;
    local_6c8 = vblendvps_avx(auVar13,auVar12,local_468);
    local_6b0 = local_c08;
    auVar8 = local_6c8;
    local_e48 = local_6c8._0_8_;
    uStackY_e40 = local_6c8._8_8_;
    local_4d8 = local_e38;
    uStackY_4d0 = uStackY_e30;
    local_4e8 = local_6c8._0_8_;
    uStackY_4e0 = local_6c8._8_8_;
    auVar9._8_8_ = uStackY_e30;
    auVar9._0_8_ = local_e38;
    local_448 = vcmpps_avx(local_6c8,auVar9,1);
    local_430 = local_e28;
    auVar10 = local_448;
    local_c58 = local_6e8._0_8_;
    uStackY_c50 = local_6e8._8_8_;
    local_c68 = local_f78;
    uStackY_c60 = uVar42;
    local_c78 = local_448._0_8_;
    uStackY_c70 = local_448._8_8_;
    local_168 = local_6e8._0_8_;
    uStackY_160 = local_6e8._8_8_;
    local_178 = local_f78;
    uStackY_170 = uVar42;
    local_188 = local_448._0_8_;
    uStackY_180 = local_448._8_8_;
    auVar14._8_8_ = uVar42;
    auVar14._0_8_ = local_f78;
    local_6a8 = vblendvps_avx(local_6e8,auVar14,local_448);
    local_690 = local_c48;
    auVar9 = local_6a8;
    lVar41 = local_ed0 + (ulong)local_f1c * 0x20;
    *(undefined8 *)(lVar41 + 0x10) = local_6a8._0_8_;
    *(undefined8 *)(lVar41 + 0x18) = local_6a8._8_8_;
    local_f1c = local_f1c + 1;
    local_838 = uVar27;
    uStackY_830 = uVar42;
    local_818 = uVar28;
    uStackY_810 = uVar29;
    local_7f8 = uVar30;
    uStackY_7f0 = uVar31;
    local_6e8 = auVar7;
    local_6c8 = auVar8;
    local_6a8 = auVar9;
    local_468 = auVar15;
    local_448 = auVar10;
    local_2d8 = auVar16;
    local_2b8 = auVar17;
    local_298 = auVar19;
  }
  __assert_fail("texel_count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                ,0x248,
                "void compute_avgs_and_dirs_3_comp_rgb(const partition_info &, const image_block &, partition_metrics *)"
               );
}

Assistant:

void compute_avgs_and_dirs_3_comp_rgb(
	const partition_info& pi,
	const image_block& blk,
	partition_metrics pm[BLOCK_MAX_PARTITIONS]
) {
	unsigned int partition_count = pi.partition_count;
	promise(partition_count > 0);

	// Pre-compute partition_averages
	vfloat4 partition_averages[BLOCK_MAX_PARTITIONS];
	compute_partition_averages_rgb(pi, blk, partition_averages);

	for (unsigned int partition = 0; partition < partition_count; partition++)
	{
		const uint8_t *texel_indexes = pi.texels_of_partition[partition];
		unsigned int texel_count = pi.partition_texel_count[partition];
		promise(texel_count > 0);

		vfloat4 average = partition_averages[partition];
		pm[partition].avg = average;

		vfloat4 sum_xp = vfloat4::zero();
		vfloat4 sum_yp = vfloat4::zero();
		vfloat4 sum_zp = vfloat4::zero();

		for (unsigned int i = 0; i < texel_count; i++)
		{
			unsigned int iwt = texel_indexes[i];

			vfloat4 texel_datum = blk.texel3(iwt);
			texel_datum = texel_datum - average;

			vfloat4 zero = vfloat4::zero();

			vmask4 tdm0 = texel_datum.swz<0,0,0,0>() > zero;
			sum_xp += select(zero, texel_datum, tdm0);

			vmask4 tdm1 = texel_datum.swz<1,1,1,1>() > zero;
			sum_yp += select(zero, texel_datum, tdm1);

			vmask4 tdm2 = texel_datum.swz<2,2,2,2>() > zero;
			sum_zp += select(zero, texel_datum, tdm2);
		}

		vfloat4 prod_xp = dot(sum_xp, sum_xp);
		vfloat4 prod_yp = dot(sum_yp, sum_yp);
		vfloat4 prod_zp = dot(sum_zp, sum_zp);

		vfloat4 best_vector = sum_xp;
		vfloat4 best_sum = prod_xp;

		vmask4 mask = prod_yp > best_sum;
		best_vector = select(best_vector, sum_yp, mask);
		best_sum = select(best_sum, prod_yp, mask);

		mask = prod_zp > best_sum;
		best_vector = select(best_vector, sum_zp, mask);

		pm[partition].dir = best_vector;
	}
}